

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O0

CURLcode ftp_pl_insert_finfo(Curl_easy *data,fileinfo *infop)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *str;
  curl_fileinfo *finfo;
  _Bool add;
  ftp_parselist_data *parser;
  Curl_llist *llist;
  ftp_wc *ftpwc;
  WildcardData *wc;
  curl_fnmatch_callback compare;
  fileinfo *infop_local;
  Curl_easy *data_local;
  
  plVar1 = (long *)(data->wildcard).protdata;
  lVar2 = *plVar1;
  bVar3 = true;
  local_78 = (infop->info).b_data;
  (infop->info).filename = local_78 + *(long *)(lVar2 + 0x28);
  if (*(long *)(lVar2 + 0x38) == 0) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = local_78 + *(long *)(lVar2 + 0x38);
  }
  (infop->info).strings.group = local_60;
  if (*(long *)(lVar2 + 0x48) == 0) {
    local_68 = (char *)0x0;
  }
  else {
    local_68 = local_78 + *(long *)(lVar2 + 0x48);
  }
  (infop->info).strings.perm = local_68;
  if (*(long *)(lVar2 + 0x50) == 0) {
    local_70 = (char *)0x0;
  }
  else {
    local_70 = local_78 + *(long *)(lVar2 + 0x50);
  }
  (infop->info).strings.target = local_70;
  (infop->info).strings.time = local_78 + *(long *)(lVar2 + 0x40);
  if (*(long *)(lVar2 + 0x30) == 0) {
    local_78 = (char *)0x0;
  }
  else {
    local_78 = local_78 + *(long *)(lVar2 + 0x30);
  }
  (infop->info).strings.user = local_78;
  wc = (WildcardData *)(data->set).fnmatch;
  if (wc == (WildcardData *)0x0) {
    wc = (WildcardData *)Curl_fnmatch;
  }
  Curl_set_in_callback(data,true);
  iVar4 = (*(code *)wc)((data->set).fnmatch_data,(data->wildcard).pattern,(infop->info).filename);
  if (iVar4 == 0) {
    if ((((infop->info).filetype == CURLFILETYPE_SYMLINK) &&
        ((infop->info).strings.target != (char *)0x0)) &&
       (pcVar5 = strstr((infop->info).strings.target," -> "), pcVar5 != (char *)0x0)) {
      bVar3 = false;
    }
  }
  else {
    bVar3 = false;
  }
  Curl_set_in_callback(data,false);
  if (bVar3) {
    Curl_llist_insert_next
              (&(data->wildcard).filelist,(data->wildcard).filelist.tail,infop,&infop->list);
  }
  else {
    Curl_fileinfo_cleanup(infop);
  }
  *(undefined8 *)(*plVar1 + 0x10) = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_pl_insert_finfo(struct Curl_easy *data,
                                    struct fileinfo *infop)
{
  curl_fnmatch_callback compare;
  struct WildcardData *wc = &data->wildcard;
  struct ftp_wc *ftpwc = wc->protdata;
  struct Curl_llist *llist = &wc->filelist;
  struct ftp_parselist_data *parser = ftpwc->parser;
  bool add = TRUE;
  struct curl_fileinfo *finfo = &infop->info;

  /* move finfo pointers to b_data */
  char *str = finfo->b_data;
  finfo->filename       = str + parser->offsets.filename;
  finfo->strings.group  = parser->offsets.group ?
                          str + parser->offsets.group : NULL;
  finfo->strings.perm   = parser->offsets.perm ?
                          str + parser->offsets.perm : NULL;
  finfo->strings.target = parser->offsets.symlink_target ?
                          str + parser->offsets.symlink_target : NULL;
  finfo->strings.time   = str + parser->offsets.time;
  finfo->strings.user   = parser->offsets.user ?
                          str + parser->offsets.user : NULL;

  /* get correct fnmatch callback */
  compare = data->set.fnmatch;
  if(!compare)
    compare = Curl_fnmatch;

  /* filter pattern-corresponding filenames */
  Curl_set_in_callback(data, true);
  if(compare(data->set.fnmatch_data, wc->pattern,
             finfo->filename) == 0) {
    /* discard symlink which is containing multiple " -> " */
    if((finfo->filetype == CURLFILETYPE_SYMLINK) && finfo->strings.target &&
       (strstr(finfo->strings.target, " -> "))) {
      add = FALSE;
    }
  }
  else {
    add = FALSE;
  }
  Curl_set_in_callback(data, false);

  if(add) {
    Curl_llist_insert_next(llist, llist->tail, finfo, &infop->list);
  }
  else {
    Curl_fileinfo_cleanup(infop);
  }

  ftpwc->parser->file_data = NULL;
  return CURLE_OK;
}